

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# okim6295.c
# Opt level: O3

void okim6295_write_rom(void *info,UINT32 offset,UINT32 length,UINT8 *data)

{
  uint uVar1;
  ulong __n;
  okim6295_state *chip;
  
  uVar1 = *(uint *)((long)info + 0xe0);
  if (offset <= uVar1 && uVar1 - offset != 0) {
    __n = (ulong)(uVar1 - offset);
    if (length + offset <= uVar1) {
      __n = (ulong)length;
    }
    memcpy((void *)((ulong)offset + *(long *)((long)info + 0xe8)),data,__n);
    return;
  }
  return;
}

Assistant:

static void okim6295_write_rom(void* info, UINT32 offset, UINT32 length, const UINT8* data)
{
	okim6295_state *chip = (okim6295_state *)info;
	
	if (offset >= chip->ROMSize)
		return;
	if (offset + length > chip->ROMSize)
		length = chip->ROMSize - offset;
	
	memcpy(&chip->ROM[offset], data, length);
	
	return;
}